

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ModuleCloner.h
# Opt level: O2

int __thiscall
soul::ModuleCloner::clone
          (ModuleCloner *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  Module *this_00;
  OutputDeclaration *args_1;
  Expression *args_3;
  WriteStream *pWVar1;
  
  this_00 = this->newModule;
  args_1 = getRemappedOutput(this,*(OutputDeclaration **)(__fn + 0x20));
  cloneExpressionPtr((ModuleCloner *)&stack0xffffffffffffffc8,
                     (pool_ptr<soul::heart::Expression> *)this);
  args_3 = cloneExpression(this,*(Expression **)(__fn + 0x30));
  pWVar1 = Module::
           allocate<soul::heart::WriteStream,soul::CodeLocation_const&,soul::heart::OutputDeclaration&,soul::pool_ptr<soul::heart::Expression>,soul::heart::Expression&>
                     (this_00,(CodeLocation *)(__fn + 8),args_1,
                      (pool_ptr<soul::heart::Expression> *)&stack0xffffffffffffffc8,args_3);
  return (int)pWVar1;
}

Assistant:

heart::WriteStream& clone (const heart::WriteStream& old)
    {
        return newModule.allocate<heart::WriteStream> (old.location,
                                                       getRemappedOutput (old.target),
                                                       cloneExpressionPtr (old.element),
                                                       cloneExpression (old.value));
    }